

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_saveDict(LZ4_stream_t *LZ4_dict,char *safeBuffer,int dictSize)

{
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  BYTE *previousDictEnd;
  LZ4_stream_t_internal *dict;
  uint local_14;
  
  local_14 = in_EDX;
  if (0x10000 < in_EDX) {
    local_14 = 0x10000;
  }
  if (*(uint *)(in_RDI + 0x4018) < local_14) {
    local_14 = *(uint *)(in_RDI + 0x4018);
  }
  if (0 < (int)local_14) {
    memmove(in_RSI,(void *)((*(long *)(in_RDI + 0x4008) + (ulong)*(uint *)(in_RDI + 0x4018)) -
                           (long)(int)local_14),(long)(int)local_14);
  }
  *(void **)(in_RDI + 0x4008) = in_RSI;
  *(uint *)(in_RDI + 0x4018) = local_14;
  return local_14;
}

Assistant:

int LZ4_saveDict (LZ4_stream_t* LZ4_dict, char* safeBuffer, int dictSize)
{
    LZ4_stream_t_internal* const dict = &LZ4_dict->internal_donotuse;
    const BYTE* const previousDictEnd = dict->dictionary + dict->dictSize;

    if ((U32)dictSize > 64 KB) { dictSize = 64 KB; } /* useless to define a dictionary > 64 KB */
    if ((U32)dictSize > dict->dictSize) { dictSize = (int)dict->dictSize; }

    if (safeBuffer == NULL) assert(dictSize == 0);
    if (dictSize > 0)
        memmove(safeBuffer, previousDictEnd - dictSize, dictSize);

    dict->dictionary = (const BYTE*)safeBuffer;
    dict->dictSize = (U32)dictSize;

    return dictSize;
}